

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O2

char * __thiscall Memory::HeapAllocator::AllocT<true>(HeapAllocator *this,size_t byteSize)

{
  HANDLE hHeap;
  HeapAllocRecord *pHVar1;
  size_t __size;
  undefined1 local_50 [8];
  TrackAllocData allocData;
  
  __size = 0xffffffffffffffff;
  if (byteSize < 0xffffffffffffffa8) {
    __size = byteSize + 0x58;
  }
  ClearTrackAllocInfo(this,(TrackAllocData *)local_50);
  if (DAT_01441dc5 == '\x01') {
    hHeap = GetPrivateHeap(this);
    pHVar1 = (HeapAllocRecord *)HeapAlloc(hHeap,0,__size);
  }
  else {
    pHVar1 = (HeapAllocRecord *)malloc(__size);
  }
  if (pHVar1 == (HeapAllocRecord *)0x0) {
    pHVar1 = (HeapAllocRecord *)0x0;
  }
  else {
    CCLock::Enter(&cs.super_CCLock);
    HeapAllocatorData::LogAlloc(&this->data,pHVar1,byteSize,(TrackAllocData *)local_50);
    CCLock::Leave(&cs.super_CCLock);
    pHVar1 = pHVar1 + 1;
  }
  return (char *)pHVar1;
}

Assistant:

char * HeapAllocator::AllocT(size_t byteSize)
{
#ifdef HEAP_TRACK_ALLOC
    size_t requestedBytes = byteSize;
    byteSize = AllocSizeMath::Add(requestedBytes, ::Math::Align<size_t>(sizeof(HeapAllocRecord), MEMORY_ALLOCATION_ALIGNMENT));
    TrackAllocData allocData;
    ClearTrackAllocInfo(&allocData);
#elif defined(HEAP_PERF_COUNTERS)
    size_t requestedBytes = byteSize;
    byteSize = AllocSizeMath::Add(requestedBytes, ::Math::Align<size_t>(sizeof(size_t), MEMORY_ALLOCATION_ALIGNMENT));
#endif

    if (noThrow)
    {
        FAULTINJECT_MEMORY_NOTHROW(_u("Heap"), byteSize);
    }
    else
    {
        FAULTINJECT_MEMORY_THROW(_u("Heap"), byteSize);
    }

    char * buffer;
#ifdef INTERNAL_MEM_PROTECT_HEAP_ALLOC
    if (DoUseMemProtectHeap())
    {
        void * memory = MemProtectHeapRootAlloc(memProtectHeapHandle, byteSize);
        if (memory == nullptr)
        {
            if (noThrow)
            {
                return nullptr;
            }
            Js::Throw::OutOfMemory();
        }
        buffer = (char *)memory;
    }
    else
#endif
    {
        if (CONFIG_FLAG(PrivateHeap))
        {
            buffer = (char *)HeapAlloc(GetPrivateHeap(), 0, byteSize);
        }
        else
        {
            buffer = (char *)malloc(byteSize);
        }
    }

    if (!noThrow && buffer == nullptr)
    {
        Js::Throw::OutOfMemory();
    }

#if defined(HEAP_TRACK_ALLOC) || defined(HEAP_PERF_COUNTERS)
    if (!noThrow || buffer != nullptr)
    {
#ifdef HEAP_TRACK_ALLOC
        cs.Enter();
        data.LogAlloc((HeapAllocRecord *)buffer, requestedBytes, allocData);
        cs.Leave();
        buffer += ::Math::Align<size_t>(sizeof(HeapAllocRecord), MEMORY_ALLOCATION_ALIGNMENT);
#else
        *(size_t *)buffer = requestedBytes;
        buffer += ::Math::Align<size_t>(sizeof(size_t), MEMORY_ALLOCATION_ALIGNMENT);

#endif
        HEAP_PERF_COUNTER_INC(LiveObject);
        HEAP_PERF_COUNTER_ADD(LiveObjectSize, requestedBytes);
    }
#endif
    return buffer;
}